

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

void __thiscall pfederc::StringToken::~StringToken(StringToken *this)

{
  StringToken *this_local;
  
  ~StringToken(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

StringToken::~StringToken() {
}